

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

bool __thiscall Env::insertvar(Env *this,string *s,attr *a)

{
  _Rb_tree_header *p_Var1;
  anon_union_8_4_35def4f3_for_attr_1 aVar2;
  undefined4 uVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
                  *)this,s);
  p_Var1 = &(this->var_table)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
             ::operator[](&this->var_table,s);
    uVar3 = *(undefined4 *)&a->field_0x4;
    aVar2 = a->field_1;
    pmVar5->kind = a->kind;
    *(undefined4 *)&pmVar5->field_0x4 = uVar3;
    pmVar5->field_1 = aVar2;
    if (a->kind == 0) {
      pcVar6 = strdup((s->_M_dataplus)._M_p);
      ((a->field_1).basic)->name = pcVar6;
    }
  }
  return (_Rb_tree_header *)iVar4._M_node == p_Var1;
}

Assistant:

bool Env::insertvar(const string &s, const struct attr &a) {
    if (var_table.find(s) != var_table.end())
        return false;
    var_table[s] = a;
    if (a.kind == BASIC) {
        a.basic->name = strdup(s.c_str());
    }
    return true;
}